

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O3

void __thiscall Epoll::Epoll(Epoll *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  value_type *__val;
  pointer peVar3;
  long lVar4;
  
  iVar2 = epoll_create1(0x80000);
  this->ep_epoll_fd = iVar2;
  p_Var1 = &(this->ep_listen_fds)._M_t._M_impl.super__Rb_tree_header;
  (this->ep_listen_fds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ep_listen_fds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ep_listen_fds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ep_listen_fds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ep_listen_fds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ep_event_map)._M_h._M_buckets = &(this->ep_event_map)._M_h._M_single_bucket;
  (this->ep_event_map)._M_h._M_bucket_count = 1;
  (this->ep_event_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ep_event_map)._M_h._M_element_count = 0;
  (this->ep_event_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ep_event_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ep_event_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ep_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ep_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ep_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar3 = (pointer)operator_new(0xc000);
  (this->ep_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_start = peVar3;
  (this->ep_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_finish = peVar3;
  (this->ep_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = peVar3 + 0x1000;
  *(undefined4 *)((long)&peVar3->data + 4) = 0;
  *(undefined8 *)peVar3 = 0;
  lVar4 = 0xc;
  do {
    *(undefined4 *)((long)&peVar3->data + lVar4 + 4) = *(undefined4 *)((long)&peVar3->data + 4);
    *(undefined8 *)((long)&peVar3->events + lVar4) = *(undefined8 *)peVar3;
    lVar4 = lVar4 + 0xc;
  } while (lVar4 != 0xc000);
  (this->ep_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_finish = peVar3 + 0x1000;
  if (0 < this->ep_epoll_fd) {
    return;
  }
  __assert_fail("ep_epoll_fd > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/epoll.cpp"
                ,0xf,"Epoll::Epoll()");
}

Assistant:

Epoll::Epoll() : ep_epoll_fd(epoll_create1(EPOLL_CLOEXEC)), ep_events(EVENTSNUM) {
    assert(ep_epoll_fd > 0);
}